

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O2

RC __thiscall PF_BufferMgr::InternalAlloc(PF_BufferMgr *this,int *slot)

{
  int iVar1;
  RC RVar2;
  PF_BufPageDesc *pPVar3;
  long lVar4;
  int *piVar5;
  
  iVar1 = this->free;
  if ((long)iVar1 == -1) {
    piVar5 = &this->last;
    pPVar3 = this->bufTable;
    do {
      lVar4 = (long)*piVar5;
      *slot = *piVar5;
      if (lVar4 == -1) {
        return -2;
      }
      piVar5 = &pPVar3[lVar4].prev;
    } while (pPVar3[lVar4].pinCount != 0);
    pPVar3 = this->bufTable;
    if (pPVar3[lVar4].bDirty != 0) {
      pPVar3 = pPVar3 + lVar4;
      RVar2 = WritePage(this,pPVar3->fd,pPVar3->pageNum,pPVar3->pData);
      if (RVar2 != 0) {
        return RVar2;
      }
      pPVar3 = this->bufTable;
      pPVar3[*slot].bDirty = 0;
      lVar4 = (long)*slot;
    }
    RVar2 = PF_HashTable::Delete(&this->hashTable,pPVar3[lVar4].fd,pPVar3[lVar4].pageNum);
    if (RVar2 != 0) {
      return RVar2;
    }
    Unlink(this,*slot);
  }
  else {
    *slot = iVar1;
    this->free = this->bufTable[iVar1].next;
  }
  LinkHead(this,*slot);
  return 0;
}

Assistant:

RC PF_BufferMgr::InternalAlloc(int &slot)
{
   RC  rc;       // return code

   // If the free list is not empty, choose a slot from the free list
   if (free != INVALID_SLOT) {
      slot = free;
      free = bufTable[slot].next;
   }
   else {

      // Choose the least-recently used page that is unpinned
      for (slot = last; slot != INVALID_SLOT; slot = bufTable[slot].prev) {
         if (bufTable[slot].pinCount == 0)
            break;
      }

      // Return error if all buffers were pinned
      if (slot == INVALID_SLOT)
         return (PF_NOBUF);

      // Write out the page if it is dirty
      if (bufTable[slot].bDirty) {
         if ((rc = WritePage(bufTable[slot].fd, bufTable[slot].pageNum,
               bufTable[slot].pData)))
            return (rc);

         bufTable[slot].bDirty = FALSE;
      }

      // Remove page from the hash table and slot from the used buffer list
      if ((rc = hashTable.Delete(bufTable[slot].fd, bufTable[slot].pageNum)) ||
            (rc = Unlink(slot)))
         return (rc);
   }

   // Link slot at the head of the used list
   if ((rc = LinkHead(slot)))
      return (rc);

   // Return ok
   return (0);
}